

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5UnicodeCreate(void *pUnused,char **azArg,int nArg,Fts5Tokenizer **ppOut)

{
  byte *pbVar1;
  uchar uVar2;
  int iVar3;
  uint uVar4;
  Unicode61Tokenizer *p;
  char *pcVar5;
  ulong uVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  
  if ((nArg & 1U) != 0) {
    return 1;
  }
  p = (Unicode61Tokenizer *)sqlite3_malloc(0xc0);
  if (p == (Unicode61Tokenizer *)0x0) {
    uVar4 = 7;
  }
  else {
    memset(p,0,0xc0);
    p->nFold = 0x40;
    p->eRemoveDiacritic = 1;
    pcVar5 = (char *)sqlite3_malloc64(0x40);
    p->aFold = pcVar5;
    pcVar7 = "L* N* Co";
    for (lVar8 = 0; (pcVar5 != (char *)0x0 && (lVar8 < nArg)); lVar8 = lVar8 + 2) {
      iVar3 = sqlite3_stricmp(azArg[lVar8],"categories");
      if (iVar3 == 0) {
        pcVar7 = azArg[lVar8 + 1];
      }
    }
    if (pcVar5 == (char *)0x0) {
      uVar4 = 7;
    }
    else {
      uVar6 = (ulong)(byte)*pcVar7;
      uVar4 = 1;
      while ((char)uVar6 != '\0') {
        while (((char)uVar6 == '\t' || ((int)uVar6 == 0x20))) {
          pbVar1 = (byte *)pcVar7 + 1;
          pcVar7 = (char *)((byte *)pcVar7 + 1);
          uVar6 = (ulong)*pbVar1;
        }
        if (((int)uVar6 != 0) &&
           (iVar3 = sqlite3Fts5UnicodeCatParse(pcVar7,p->aCategory), iVar3 != 0)) goto LAB_0019a687;
        while ((uVar6 = (ulong)(byte)*pcVar7, 0x20 < uVar6 ||
               ((0x100000201U >> (uVar6 & 0x3f) & 1) == 0))) {
          pcVar7 = (char *)((byte *)pcVar7 + 1);
        }
      }
      uVar4 = 0;
      lVar8 = 0;
      lVar9 = 0;
      while (iVar3 = (int)lVar9, iVar3 < 0x80) {
        uVar2 = p->aCategory[aFts5UnicodeData[lVar8] & 0x1f];
        iVar10 = (uint)(aFts5UnicodeData[lVar8] >> 5) + iVar3;
        if (0x7f < iVar10) {
          iVar10 = 0x80;
        }
        for (lVar9 = (long)iVar3; lVar9 < iVar10; lVar9 = lVar9 + 1) {
          p->aTokenChar[lVar9] = uVar2;
        }
        lVar8 = lVar8 + 1;
      }
    }
LAB_0019a687:
    for (lVar8 = 0; (uVar4 == 0 && (lVar8 < nArg)); lVar8 = lVar8 + 2) {
      pcVar7 = azArg[lVar8];
      pbVar1 = (byte *)azArg[lVar8 + 1];
      iVar3 = sqlite3_stricmp(pcVar7,"remove_diacritics");
      if (iVar3 == 0) {
        uVar4 = 1;
        if (((byte)(*pbVar1 - 0x30) < 3) && (uVar4 = 1, pbVar1[1] == 0)) {
          p->eRemoveDiacritic = *pbVar1 - 0x30;
          uVar4 = 0;
        }
      }
      else {
        iVar3 = sqlite3_stricmp(pcVar7,"tokenchars");
        if (iVar3 == 0) {
          iVar3 = 1;
        }
        else {
          iVar3 = sqlite3_stricmp(pcVar7,"separators");
          if (iVar3 != 0) {
            iVar3 = sqlite3_stricmp(pcVar7,"categories");
            uVar4 = (uint)(iVar3 != 0);
            goto LAB_0019a744;
          }
          iVar3 = 0;
        }
        uVar4 = fts5UnicodeAddExceptions(p,(char *)pbVar1,iVar3);
      }
LAB_0019a744:
    }
    if (uVar4 == 0) {
      uVar4 = 0;
      goto LAB_0019a767;
    }
  }
  fts5UnicodeDelete((Fts5Tokenizer *)p);
  p = (Unicode61Tokenizer *)0x0;
LAB_0019a767:
  *ppOut = (Fts5Tokenizer *)p;
  return uVar4;
}

Assistant:

static int fts5UnicodeCreate(
  void *pUnused, 
  const char **azArg, int nArg,
  Fts5Tokenizer **ppOut
){
  int rc = SQLITE_OK;             /* Return code */
  Unicode61Tokenizer *p = 0;      /* New tokenizer object */ 

  UNUSED_PARAM(pUnused);

  if( nArg%2 ){
    rc = SQLITE_ERROR;
  }else{
    p = (Unicode61Tokenizer*)sqlite3_malloc(sizeof(Unicode61Tokenizer));
    if( p ){
      const char *zCat = "L* N* Co";
      int i;
      memset(p, 0, sizeof(Unicode61Tokenizer));

      p->eRemoveDiacritic = FTS5_REMOVE_DIACRITICS_SIMPLE;
      p->nFold = 64;
      p->aFold = sqlite3_malloc64(p->nFold * sizeof(char));
      if( p->aFold==0 ){
        rc = SQLITE_NOMEM;
      }

      /* Search for a "categories" argument */
      for(i=0; rc==SQLITE_OK && i<nArg; i+=2){
        if( 0==sqlite3_stricmp(azArg[i], "categories") ){
          zCat = azArg[i+1];
        }
      }

      if( rc==SQLITE_OK ){
        rc = unicodeSetCategories(p, zCat);
      }

      for(i=0; rc==SQLITE_OK && i<nArg; i+=2){
        const char *zArg = azArg[i+1];
        if( 0==sqlite3_stricmp(azArg[i], "remove_diacritics") ){
          if( (zArg[0]!='0' && zArg[0]!='1' && zArg[0]!='2') || zArg[1] ){
            rc = SQLITE_ERROR;
          }else{
            p->eRemoveDiacritic = (zArg[0] - '0');
            assert( p->eRemoveDiacritic==FTS5_REMOVE_DIACRITICS_NONE
                 || p->eRemoveDiacritic==FTS5_REMOVE_DIACRITICS_SIMPLE
                 || p->eRemoveDiacritic==FTS5_REMOVE_DIACRITICS_COMPLEX
            );
          }
        }else
        if( 0==sqlite3_stricmp(azArg[i], "tokenchars") ){
          rc = fts5UnicodeAddExceptions(p, zArg, 1);
        }else
        if( 0==sqlite3_stricmp(azArg[i], "separators") ){
          rc = fts5UnicodeAddExceptions(p, zArg, 0);
        }else
        if( 0==sqlite3_stricmp(azArg[i], "categories") ){
          /* no-op */
        }else{
          rc = SQLITE_ERROR;
        }
      }

    }else{
      rc = SQLITE_NOMEM;
    }
    if( rc!=SQLITE_OK ){
      fts5UnicodeDelete((Fts5Tokenizer*)p);
      p = 0;
    }
    *ppOut = (Fts5Tokenizer*)p;
  }
  return rc;
}